

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

xmlBufPtr xmlBufCreateMem(xmlChar *mem,size_t size,int isStatic)

{
  void *pvVar1;
  xmlBufPtr ret;
  int isStatic_local;
  size_t size_local;
  xmlChar *mem_local;
  
  if (mem == (xmlChar *)0x0) {
    mem_local = (xmlChar *)0x0;
  }
  else {
    mem_local = (xmlChar *)(*xmlMalloc)(0x38);
    if (mem_local == (xmlChar *)0x0) {
      mem_local = (xmlChar *)0x0;
    }
    else {
      if (isStatic == 0) {
        mem_local[0x30] = '\0';
        mem_local[0x31] = '\0';
        mem_local[0x32] = '\0';
        mem_local[0x33] = '\0';
        pvVar1 = (*xmlMalloc)(size + 1);
        *(void **)(mem_local + 0x10) = pvVar1;
        if (*(long *)(mem_local + 0x10) == 0) {
          (*xmlFree)(mem_local);
          return (xmlBufPtr)0x0;
        }
        memcpy(*(void **)(mem_local + 0x10),mem,size);
        *(undefined1 *)(*(long *)(mem_local + 0x10) + size) = 0;
      }
      else {
        if (mem[size] != '\0') {
          (*xmlFree)(mem_local);
          return (xmlBufPtr)0x0;
        }
        mem_local[0x30] = '\x04';
        mem_local[0x31] = '\0';
        mem_local[0x32] = '\0';
        mem_local[0x33] = '\0';
        *(xmlChar **)(mem_local + 0x10) = mem;
      }
      *(size_t *)(mem_local + 0x18) = size;
      *(size_t *)(mem_local + 0x20) = size;
      mem_local[0x28] = 0xfe;
      mem_local[0x29] = 0xff;
      mem_local[0x2a] = 0xff;
      mem_local[0x2b] = 0xff;
      mem_local[0x2c] = 0xff;
      mem_local[0x2d] = 0xff;
      mem_local[0x2e] = 0xff;
      mem_local[0x2f] = 0xff;
      *(undefined8 *)mem_local = *(undefined8 *)(mem_local + 0x10);
      if (*(ulong *)(mem_local + 0x20) < 0x7fffffff) {
        *(int *)(mem_local + 0xc) = (int)*(undefined8 *)(mem_local + 0x20);
      }
      else {
        mem_local[0xc] = 0xff;
        mem_local[0xd] = 0xff;
        mem_local[0xe] = 0xff;
        mem_local[0xf] = '\x7f';
      }
      if (*(ulong *)(mem_local + 0x18) < 0x7fffffff) {
        *(int *)(mem_local + 8) = (int)*(undefined8 *)(mem_local + 0x18);
      }
      else {
        mem_local[8] = 0xff;
        mem_local[9] = 0xff;
        mem_local[10] = 0xff;
        mem_local[0xb] = '\x7f';
      }
    }
  }
  return (xmlBufPtr)mem_local;
}

Assistant:

xmlBufPtr
xmlBufCreateMem(const xmlChar *mem, size_t size, int isStatic) {
    xmlBufPtr ret;

    if (mem == NULL)
        return(NULL);

    ret = xmlMalloc(sizeof(*ret));
    if (ret == NULL)
        return(NULL);

    if (isStatic) {
        /* Check that memory is zero-terminated */
        if (mem[size] != 0) {
            xmlFree(ret);
            return(NULL);
        }
        ret->flags = BUF_FLAG_STATIC;
        ret->mem = (xmlChar *) mem;
    } else {
        ret->flags = 0;
        ret->mem = xmlMalloc(size + 1);
        if (ret->mem == NULL) {
            xmlFree(ret);
            return(NULL);
        }
        memcpy(ret->mem, mem, size);
        ret->mem[size] = 0;
    }

    ret->use = size;
    ret->size = size;
    ret->maxSize = SIZE_MAX - 1;
    ret->content = ret->mem;

    UPDATE_COMPAT(ret);
    return(ret);
}